

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

wostream * mjs::operator<<(wostream *os,completion_type *t)

{
  wostream *pwVar1;
  wostringstream _woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  if ((ulong)*t < 5) {
    pwVar1 = std::operator<<(os,&DAT_0018ed48 + *(int *)(&DAT_0018ed48 + (ulong)*t * 4));
    return pwVar1;
  }
  std::__cxx11::wostringstream::wostringstream(local_188);
  pwVar1 = std::operator<<((wostream *)local_188,"Not implemented: ");
  std::wostream::operator<<((wostream *)pwVar1,*t);
  std::__cxx11::wstringbuf::str();
  throw_runtime_error(&local_198,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                      ,0x1d);
}

Assistant:

std::wostream& operator<<(std::wostream& os, const completion_type& t) {
    switch (t) {
    case completion_type::normal: return os << "normal completion";
    case completion_type::break_: return os << "break";
    case completion_type::continue_: return os << "continue";
    case completion_type::return_: return os << "return";
    case completion_type::throw_: return os << "throw";
    }
    NOT_IMPLEMENTED((int)t);
}